

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

size_t tinyexr::SaveEXRNPartImageToMemory
                 (EXRImage *exr_images,EXRHeader **exr_headers,uint num_parts,uchar **memory_out,
                 char **err)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  pointer pTVar5;
  undefined8 uVar6;
  EXRAttribute *pEVar7;
  pointer pcVar8;
  long *plVar9;
  EXRTile *pEVar10;
  uchar **ppuVar11;
  pointer pvVar12;
  undefined8 uVar13;
  int *piVar14;
  pointer pvVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  pointer puVar21;
  bool bVar22;
  byte bVar23;
  byte bVar24;
  bool bVar25;
  bool bVar26;
  int iVar27;
  uint uVar28;
  size_t c_1;
  void *pvVar29;
  reference pvVar30;
  size_t sVar31;
  EXRHeader *pEVar32;
  pointer pvVar33;
  ulong uVar34;
  void *pvVar35;
  uchar *puVar36;
  int iVar37;
  int iVar38;
  size_type *psVar39;
  size_type sVar40;
  pointer pOVar41;
  int iVar42;
  int iVar43;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *pvVar44;
  size_t c;
  ulong uVar45;
  long lVar46;
  EXRHeader **ppEVar47;
  uint uVar48;
  char *pcVar49;
  unsigned_long uVar50;
  long lVar51;
  long lVar52;
  int j;
  EXRImage *pEVar53;
  ulong uVar54;
  void *compression_param;
  int iVar55;
  long lVar56;
  pointer puVar57;
  uint i_1;
  long lVar58;
  reference pvVar59;
  bool bVar60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar61;
  string *psVar62;
  void *pvVar63;
  pointer local_218;
  char header [4];
  char acStack_204 [4];
  pointer pTStack_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  int local_1e8;
  int local_1e4;
  undefined8 local_1e0;
  uchar local_1d8;
  allocator local_1c1;
  char **local_1c0;
  EXRHeader **local_1b8;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *local_1b0;
  pointer local_1a8;
  void *local_1a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> memory;
  vector<int,_std::allocator<int>_> num_y_tiles;
  vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
  data_lists;
  long local_120;
  vector<int,_std::allocator<int>_> chunk_count;
  vector<unsigned_long,_std::allocator<unsigned_long>_> channel_offset_list;
  vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_> offset_data;
  vector<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>,_std::allocator<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>_>_>
  channels;
  
  if (memory_out != (uchar **)0x0 &&
      (exr_headers != (EXRHeader **)0x0 && exr_images != (EXRImage *)0x0)) {
    compression_param = (void *)(ulong)num_parts;
    pvVar29 = (void *)0x0;
    while (local_1c0 = err, compression_param != pvVar29) {
      ppEVar47 = exr_headers + (long)pvVar29;
      if ((*ppEVar47)->compression_type < 0) {
        pcVar49 = "Invalid argument for SaveEXRNPartImageToMemory";
        goto LAB_001aafa4;
      }
      pvVar29 = (void *)((long)pvVar29 + 1);
      if ((*ppEVar47)->compression_type == 0x80) goto code_r0x001aaf43;
    }
    memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    builtin_strncpy(header,"v/1\x01",4);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<char_const*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&memory,(const_iterator)0x0,
               header,acStack_204);
    header[0] = '\x02';
    header[1] = '\0';
    header[2] = '\0';
    header[3] = '\0';
    if ((num_parts == 1) && (exr_images->tiles != (EXRTile *)0x0)) {
      header[0] = '\x02';
      header[1] = '\x02';
      bVar23 = 2;
    }
    else {
      bVar23 = 0;
    }
    bVar24 = bVar23;
    if ((*exr_headers)->long_name != 0) {
      bVar24 = bVar23 | 4;
      header._0_2_ = CONCAT11(bVar23,header[0]) | 0x400;
    }
    if (1 < num_parts) {
      header._0_2_ = CONCAT11(bVar24,header[0]) | 0x1000;
    }
    std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<char*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&memory,
               (const_iterator)
               memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish,header,acStack_204);
    std::vector<int,_std::allocator<int>_>::vector
              (&chunk_count,(size_type)compression_param,(allocator_type *)header);
    std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::vector
              (&offset_data,(size_type)compression_param,(allocator_type *)header);
    lVar58 = 0;
    iVar42 = 0;
    pEVar53 = exr_images;
    local_1b8 = exr_headers;
    for (pvVar29 = (void *)0x0; ppEVar47 = local_1b8, compression_param != pvVar29;
        pvVar29 = (void *)((long)pvVar29 + 1)) {
      if (pEVar53->tiles == (EXRTile *)0x0) {
        iVar27 = local_1b8[(long)pvVar29]->compression_type;
        iVar37 = 0x10;
        if ((iVar27 != 3) && (iVar37 = 0x10, iVar27 != 0x80)) {
          if (iVar27 == 4) {
            iVar37 = 0x20;
          }
          else {
            iVar37 = 1;
          }
        }
        chunk_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[(long)pvVar29] = (pEVar53->height + iVar37 + -1) / iVar37;
        InitSingleResolutionOffsets
                  ((OffsetData *)
                   ((long)&((offset_data.
                             super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>
                             ._M_impl.super__Vector_impl_data._M_start)->offsets).
                           super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar58),
                   (long)chunk_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[(long)pvVar29]);
        iVar27 = chunk_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[(long)pvVar29];
      }
      else {
        _header = (undefined1  [16])0x0;
        local_1f8._M_allocated_capacity = 0;
        num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        PrecalculateTileInfo
                  ((vector<int,_std::allocator<int>_> *)header,
                   (vector<int,_std::allocator<int>_> *)
                   &num_y_tiles.super__Vector_base<int,_std::allocator<int>_>,
                   local_1b8[(long)pvVar29]);
        iVar27 = InitTileOffsets((OffsetData *)
                                 ((long)&((offset_data.
                                           super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->offsets).
                                         super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar58),
                                 ppEVar47[(long)pvVar29],(vector<int,_std::allocator<int>_> *)header
                                 ,(vector<int,_std::allocator<int>_> *)
                                  &num_y_tiles.super__Vector_base<int,_std::allocator<int>_>);
        chunk_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[(long)pvVar29] = iVar27;
        iVar27 = chunk_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[(long)pvVar29];
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&num_y_tiles.super__Vector_base<int,_std::allocator<int>_>);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)header);
      }
      iVar42 = iVar42 + iVar27;
      pEVar53 = pEVar53 + 1;
      lVar58 = lVar58 + 0x20;
    }
    pvVar63 = compression_param;
    std::
    vector<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>,_std::allocator<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>_>_>
    ::vector(&channels,(size_type)compression_param,(allocator_type *)header);
    num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish._0_4_ = 0;
    num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    for (pvVar29 = (void *)0x0; pvVar29 != compression_param; pvVar29 = (void *)((long)pvVar29 + 1))
    {
      data_lists.
      super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      data_lists.
      super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      data_lists.
      super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      lVar58 = 0;
      pvVar35 = pvVar29;
      compression_param = pvVar63;
      for (lVar56 = 0; pEVar32 = ppEVar47[(long)pvVar35], lVar56 < pEVar32->num_channels;
          lVar56 = lVar56 + 1) {
        pTStack_200 = (pointer)0x0;
        _header = (pointer)&local_1f8;
        local_1f8._M_allocated_capacity = local_1f8._M_allocated_capacity & 0xffffffffffffff00;
        local_1d8 = '\0';
        local_1e8 = pEVar32->pixel_types[lVar56];
        local_1e4 = pEVar32->requested_pixel_types[lVar56];
        local_1e0._0_4_ = 1;
        local_1e0._4_4_ = 1;
        std::__cxx11::string::string
                  ((string *)&channel_offset_list,pEVar32->channels->name + lVar58,&local_1c1);
        std::__cxx11::string::operator=((string *)header,(string *)&channel_offset_list);
        std::__cxx11::string::~string((string *)&channel_offset_list);
        std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::push_back
                  (channels.
                   super__Vector_base<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>,_std::allocator<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + (long)pvVar29,(value_type *)header);
        std::__cxx11::string::~string((string *)header);
        lVar58 = lVar58 + 0x110;
      }
      pvVar33 = channels.
                super__Vector_base<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>,_std::allocator<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + (long)pvVar29;
      pTVar5 = channels.
               super__Vector_base<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>,_std::allocator<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)pvVar29].
               super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar58 = ((long)channels.
                      super__Vector_base<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>,_std::allocator<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[(long)pvVar29].
                      super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar5) / 0x38;
      psVar39 = &(pTVar5->name)._M_string_length;
      lVar56 = 0;
      while (bVar60 = lVar58 != 0, lVar58 = lVar58 + -1, bVar60) {
        lVar56 = lVar56 + *psVar39 + 0x11;
        psVar39 = psVar39 + 7;
      }
      pvVar29 = pvVar35;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&data_lists,lVar56 + 1);
      pvVar30 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&data_lists,0);
      lVar58 = 0;
      for (uVar45 = 0;
          pTVar5 = (pvVar33->
                   super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                   )._M_impl.super__Vector_impl_data._M_start,
          uVar45 < (ulong)(((long)(pvVar33->
                                  super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar5) / 0x38
                          ); uVar45 = uVar45 + 1) {
        memcpy(pvVar30,*(void **)(pTVar5->pad + lVar58 + -0x31),
               *(size_t *)(pTVar5->pad + lVar58 + -0x29));
        pvVar59 = pvVar30 + *(long *)(((pvVar33->
                                       super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                                       )._M_impl.super__Vector_impl_data._M_start)->pad +
                                     lVar58 + -0x29);
        pvVar30 = pvVar59 + 0x11;
        *pvVar59 = '\0';
        pTVar5 = (pvVar33->
                 super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        uVar6 = *(undefined8 *)(pTVar5->pad + lVar58 + -9);
        *(undefined4 *)(pvVar59 + 1) = *(undefined4 *)(pTVar5->pad + lVar58 + -0xd);
        pvVar59[5] = ((pvVar33->
                      super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                      )._M_impl.super__Vector_impl_data._M_start)->pad[lVar58 + -1];
        *(undefined8 *)(pvVar59 + 9) = uVar6;
        lVar58 = lVar58 + 0x38;
      }
      *pvVar30 = '\0';
      pvVar30 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&data_lists,0);
      WriteAttributeToMemory
                (&memory,"channels","chlist",pvVar30,
                 (int)data_lists.
                      super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                 (int)data_lists.
                      super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data_lists);
      ppEVar47 = local_1b8;
      header = (char  [4])local_1b8[(long)pvVar35]->compression_type;
      WriteAttributeToMemory(&memory,"compression","compression",(uchar *)header,1);
      uVar1 = exr_images[(long)pvVar35].width;
      uVar3 = exr_images[(long)pvVar35].height;
      auVar20._4_4_ = uVar3 + -1;
      auVar20._0_4_ = uVar1 + -1;
      auVar20._8_8_ = 0;
      _header = auVar20 << 0x40;
      WriteAttributeToMemory(&memory,"dataWindow","box2i",(uchar *)header,0x10);
      channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      uVar2 = exr_images->width;
      uVar4 = exr_images->height;
      channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)CONCAT44(uVar4 + -1,uVar2 + -1);
      WriteAttributeToMemory(&memory,"displayWindow","box2i",(uchar *)&channel_offset_list,0x10);
      auVar16[0xf] = 0;
      auVar16._0_15_ = stack0xfffffffffffffdf9;
      _header = auVar16 << 8;
      WriteAttributeToMemory(&memory,"lineOrder","lineOrder",(uchar *)header,1);
      header[0] = '\0';
      header[1] = '\0';
      header[2] = -0x80;
      header[3] = '?';
      WriteAttributeToMemory(&memory,"pixelAspectRatio","float",(uchar *)header,4);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = pTStack_200;
      _header = auVar17 << 0x40;
      WriteAttributeToMemory(&memory,"screenWindowCenter","v2f",(uchar *)header,8);
      header[0] = '\0';
      header[1] = '\0';
      header[2] = -0x80;
      header[3] = '?';
      WriteAttributeToMemory(&memory,"screenWindowWidth","float",(uchar *)header,4);
      if (exr_images[(long)pvVar35].tiles != (EXRTile *)0x0) {
        pEVar32 = ppEVar47[(long)pvVar29];
        bVar24 = (byte)pEVar32->tile_level_mode & 3;
        bVar23 = bVar24 + 0x10;
        if (pEVar32->tile_rounding_mode == 0) {
          bVar23 = bVar24;
        }
        pTStack_200._0_4_ = 0;
        pTStack_200._0_1_ = bVar23;
        header = (char  [4])pEVar32->tile_size_x;
        acStack_204 = (char  [4])pEVar32->tile_size_y;
        WriteAttributeToMemory(&memory,"tiles","tiledesc",(uchar *)header,9);
      }
      if (1 < num_parts) {
        pEVar32 = ppEVar47[(long)pvVar29];
        sVar31 = strlen(pEVar32->name);
        if (sVar31 == 0) {
          std::__cxx11::string::string
                    ((string *)header,"Invalid \'name\' attribute for a multi-part file",
                     (allocator *)&channel_offset_list);
        }
        else {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_emplace_unique<char_const(&)[256]>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&num_y_tiles,&pEVar32->name);
          if (pvVar29 == (void *)0xffffffffffffffff) {
            WriteAttributeToMemory(&memory,"name","string",(uchar *)ppEVar47[-1]->name,(int)sVar31);
            bVar60 = exr_images[(long)pvVar35].tiles == (EXRTile *)0x0;
            pcVar49 = "tiledimage";
            if (bVar60) {
              pcVar49 = "scanlineimage";
            }
            WriteAttributeToMemory(&memory,"type","string",(uchar *)pcVar49,(uint)bVar60 * 3 + 10);
            WriteAttributeToMemory
                      (&memory,"chunkCount","int",
                       (uchar *)(chunk_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start + -1),4);
            goto LAB_001ab664;
          }
          std::__cxx11::string::string
                    ((string *)header,"\'name\' attributes must be unique for a multi-part file",
                     (allocator *)&channel_offset_list);
        }
        SetErrorMessage((string *)header,local_1c0);
        std::__cxx11::string::~string((string *)header);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&num_y_tiles);
        local_218 = (pointer)0x0;
        goto LAB_001ac1da;
      }
LAB_001ab664:
      pEVar32 = ppEVar47[(long)pvVar29];
      iVar27 = pEVar32->num_custom_attributes;
      pvVar63 = compression_param;
      if (0 < iVar27) {
        lVar56 = 0;
        for (lVar58 = 0; lVar58 < iVar27; lVar58 = lVar58 + 1) {
          pEVar7 = pEVar32->custom_attributes;
          WriteAttributeToMemory
                    (&memory,pEVar7->name + lVar56,pEVar7->type + lVar56,
                     *(uchar **)((long)&pEVar7->value + lVar56),
                     *(int *)((long)&pEVar7->size + lVar56));
          pEVar32 = ppEVar47[(long)pvVar29];
          iVar27 = pEVar32->num_custom_attributes;
          lVar56 = lVar56 + 0x210;
        }
      }
      auVar18[0xf] = 0;
      auVar18._0_15_ = stack0xfffffffffffffdf9;
      _header = auVar18 << 8;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&memory,(uchar *)header);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&num_y_tiles);
    if (1 < num_parts) {
      auVar19[0xf] = 0;
      auVar19._0_15_ = stack0xfffffffffffffdf9;
      _header = auVar19 << 8;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&memory,(uchar *)header);
    }
    puVar57 = memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar21 = memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish;
    std::
    vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
    ::vector(&data_lists,(size_type)compression_param,(allocator_type *)header);
    lVar58 = (ulong)(1 < num_parts) * 4;
    pvVar29 = (void *)0x0;
    local_218 = (pointer)0x0;
    local_1a8 = puVar21 + ((long)iVar42 * 8 - (long)puVar57);
    do {
      if (pvVar29 == compression_param) {
        if (local_218 == (pointer)0x0) {
          std::__cxx11::string::string
                    ((string *)header,"Output memory size is zero",(allocator *)&num_y_tiles);
          SetErrorMessage((string *)header,local_1c0);
          std::__cxx11::string::~string((string *)header);
          break;
        }
        puVar36 = (uchar *)malloc((size_t)local_218);
        *memory_out = puVar36;
        sVar31 = (long)memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
        memcpy(puVar36,memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,sVar31);
        puVar36 = puVar36 + sVar31;
        pvVar29 = (void *)0x0;
        while (pvVar29 != compression_param) {
          if (exr_images[(long)pvVar29].tiles == (EXRTile *)0x0) {
            iVar42 = chunk_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(long)pvVar29];
            memcpy(puVar36,(void *)**(undefined8 **)
                                     &((offset_data.
                                        super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>
                                        ._M_impl.super__Vector_impl_data._M_start[(long)pvVar29].
                                        offsets.
                                        super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                      )._M_impl,(long)iVar42 * 8);
            puVar36 = puVar36 + (long)iVar42 * 8;
            pvVar35 = pvVar29;
          }
          else {
            if (ppEVar47[(long)pvVar29]->tile_level_mode == 2) {
              uVar48 = offset_data.
                       super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)pvVar29].num_y_levels *
                       offset_data.
                       super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)pvVar29].num_x_levels;
            }
            else {
              uVar48 = offset_data.
                       super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)pvVar29].num_x_levels;
            }
            if ((int)uVar48 < 1) {
              uVar48 = 0;
            }
            uVar45 = 0;
            pOVar41 = offset_data.
                      super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            compression_param = pvVar63;
            local_1a0 = pvVar29;
            while (pvVar35 = local_1a0, pvVar63 = compression_param, uVar45 != uVar48) {
              lVar58 = 8;
              uVar34 = uVar45;
              for (uVar54 = 0;
                  pvVar15 = pOVar41[(long)pvVar29].offsets.
                            super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                  lVar56 = *(long *)&pvVar15[uVar45].
                                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                     ._M_impl,
                  uVar54 < (ulong)(((long)*(pointer *)
                                           ((long)&pvVar15[uVar45].
                                                                                                      
                                                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                                  ._M_impl + 8) - lVar56) / 0x18);
                  uVar54 = uVar54 + 1) {
                pvVar63 = *(void **)(lVar56 + -8 + lVar58);
                sVar31 = *(long *)(lVar56 + lVar58) - (long)pvVar63;
                memcpy(puVar36,pvVar63,sVar31);
                puVar36 = puVar36 + sVar31;
                lVar58 = lVar58 + 0x18;
                pOVar41 = offset_data.
                          super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              }
              ppEVar47 = local_1b8;
              uVar45 = uVar34 + 1;
            }
          }
          pvVar29 = (void *)((long)pvVar35 + 1);
        }
        for (pvVar29 = (void *)0x0; pvVar29 != compression_param;
            pvVar29 = (void *)((long)pvVar29 + 1)) {
          lVar58 = 8;
          compression_param = pvVar63;
          for (uVar45 = 0;
              uVar45 < (ulong)(long)chunk_count.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start[(long)pvVar29];
              uVar45 = uVar45 + 1) {
            if (1 < num_parts) {
              *(int *)puVar36 = (int)pvVar29;
              puVar36 = puVar36 + 4;
            }
            pvVar12 = data_lists.
                      super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[(long)pvVar29].
                      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pvVar63 = *(void **)((long)pvVar12 + lVar58 + -8);
            memcpy(puVar36,pvVar63,
                   *(long *)((long)&(pvVar12->
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    )._M_impl.super__Vector_impl_data + lVar58) - (long)pvVar63);
            pvVar12 = data_lists.
                      super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[(long)pvVar29].
                      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            puVar36 = puVar36 + (*(long *)((long)&(pvVar12->
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  )._M_impl.super__Vector_impl_data + lVar58) -
                                *(long *)((long)pvVar12 + lVar58 + -8));
            lVar58 = lVar58 + 0x18;
          }
          pvVar63 = compression_param;
        }
        goto LAB_001ac1cd;
      }
      num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
      num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)((ulong)num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
      pEVar32 = ppEVar47[(long)pvVar29];
      iVar42 = pEVar32->compression_type;
      iVar27 = 0x10;
      if ((iVar42 != 3) && (iVar42 != 0x80)) {
        if (iVar42 == 4) {
          iVar27 = 0x20;
        }
        else {
          iVar27 = 1;
        }
      }
      pvVar33 = channels.
                super__Vector_base<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>,_std::allocator<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + (long)pvVar29;
      uVar48 = chunk_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[(long)pvVar29];
      psVar62 = (string *)
                (offset_data.
                 super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>.
                 _M_impl.super__Vector_impl_data._M_start + (long)pvVar29);
      pvVar44 = data_lists.
                super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + (long)pvVar29;
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::resize(pvVar44,(long)(int)uVar48);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&channel_offset_list,(long)pEVar32->num_channels,(allocator_type *)header);
      pEVar53 = exr_images + (long)pvVar29;
      lVar56 = 0x24;
      uVar50 = 0;
      iVar42 = 0;
      for (uVar45 = 0; uVar45 < (ulong)(long)pEVar32->num_channels; uVar45 = uVar45 + 1) {
        channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar45] = uVar50;
        iVar37 = *(int *)(((pvVar33->
                           super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                           )._M_impl.super__Vector_impl_data._M_start)->pad + lVar56 + -0x31);
        if ((iVar37 == 0) || (iVar37 == 2)) {
          iVar42 = iVar42 + 4;
          uVar50 = uVar50 + 4;
        }
        else if (iVar37 == 1) {
          iVar42 = iVar42 + 2;
          uVar50 = uVar50 + 2;
        }
        lVar56 = lVar56 + 0x38;
      }
      iVar37 = (int)pvVar33;
      local_1b0 = pvVar44;
      if (pEVar53->tiles == (EXRTile *)0x0) {
        plVar9 = *(long **)(psVar62->_M_dataplus)._M_p;
        psVar62 = (string *)0x0;
        uVar45 = 0;
        if (0 < (int)uVar48) {
          uVar45 = (ulong)uVar48;
        }
        iVar43 = 0;
        pvVar35 = (void *)0x0;
        iVar38 = iVar27;
        for (lVar56 = 0; pvVar44 = local_1b0, uVar45 * 0x18 != lVar56; lVar56 = lVar56 + 0x18) {
          iVar55 = pEVar53->height;
          ppuVar11 = pEVar53->images;
          pvVar61 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1abd1c;
          local_1a0 = pvVar35;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     ((long)&(((local_1b0->
                               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data + lVar56),8);
          if (iVar38 <= iVar55) {
            iVar55 = iVar38;
          }
          pvVar12 = (pvVar44->
                    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          uVar6 = *(undefined8 *)
                   ((long)&(pvVar12->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data + lVar56);
          uVar13 = *(undefined8 *)
                    ((long)&(pvVar12->
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data + lVar56 + 8);
          uVar28 = pEVar53->width;
          uVar34 = (ulong)uVar28;
          compression_param = pvVar63;
          bVar60 = EncodePixelData((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   ((long)&(pvVar12->
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           )._M_impl.super__Vector_impl_data + lVar56),ppuVar11,
                                   pEVar32->compression_type,uVar28,uVar28,iVar43,
                                   iVar55 + (int)psVar62,iVar42,iVar37,(size_t)&channel_offset_list,
                                   (vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                                    *)&num_y_tiles,pvVar61,psVar62,pvVar63);
          uVar34 = CONCAT71((int7)(uVar34 >> 8),1);
          if (bVar60) {
            pvVar12 = (local_1b0->
                      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            iVar55 = *(int *)((long)&(pvVar12->
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     )._M_impl.super__Vector_impl_data + lVar56 + 8);
            piVar14 = *(int **)((long)&(pvVar12->
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       )._M_impl.super__Vector_impl_data + lVar56);
            *piVar14 = iVar43;
            *(int *)(*(long *)((long)&(((local_1b0->
                                        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start)->
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      )._M_impl.super__Vector_impl_data + lVar56) + 4) =
                 ((int)uVar6 + iVar55) - ((int)uVar13 + (int)piVar14);
            uVar34 = (ulong)local_1a0 & 0xffffffff;
          }
          iVar43 = iVar43 + iVar27;
          psVar62 = (string *)(ulong)(uint)((int)psVar62 - iVar27);
          iVar38 = iVar38 + iVar27;
          pvVar35 = (void *)(uVar34 & 0xffffffff);
          pvVar63 = compression_param;
        }
        if (((ulong)pvVar35 & 1) == 0) {
          lVar56 = 1;
          local_218 = local_1a8;
          for (sVar40 = 0; (long)(int)uVar48 != sVar40; sVar40 = sVar40 + 1) {
            *(pointer *)(*plVar9 + sVar40 * 8) = local_218;
            pvVar12 = (local_1b0->
                      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            local_218 = local_218 +
                        ((*(long *)((long)&(pvVar12->
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           )._M_impl.super__Vector_impl_data + lVar56 * 8) + lVar58)
                        - *(long *)((long)pvVar12 + lVar56 * 8 + -8));
            lVar56 = lVar56 + 3;
          }
          bVar60 = true;
          ppEVar47 = local_1b8;
        }
        else {
          std::__cxx11::string::append((char *)&num_y_tiles);
          bVar60 = false;
          ppEVar47 = local_1b8;
        }
      }
      else {
        iVar27 = 1;
        if (pEVar32->tile_level_mode == 2) {
          iVar27 = *(int *)((long)&psVar62->field_2 + 0xc);
        }
        uVar48 = iVar27 * *(int *)((long)&psVar62->field_2 + 8);
        if ((int)uVar48 < 1) {
          uVar48 = 0;
        }
        uVar45 = 0;
        local_120 = 0;
        puVar57 = local_1a8;
        compression_param = pvVar63;
        do {
          bVar60 = uVar45 == uVar48;
          if (bVar60) {
            bVar60 = true;
            pvVar63 = compression_param;
            local_218 = puVar57;
            break;
          }
          if (pEVar53 == (EXRImage *)0x0) {
            std::__cxx11::string::append((char *)&num_y_tiles);
LAB_001abeca:
            bVar60 = false;
            pvVar63 = compression_param;
            break;
          }
          if (pEVar32->tile_level_mode == 2) {
            uVar28 = pEVar53->level_y * *(int *)((long)&psVar62->field_2 + 8) + pEVar53->level_x;
          }
          else {
            uVar28 = 0;
            if (pEVar32->tile_level_mode == 1) {
              uVar28 = pEVar53->level_x;
            }
          }
          if (uVar45 != uVar28) {
            std::__cxx11::string::append((char *)&num_y_tiles);
            goto LAB_001abeca;
          }
          pcVar8 = (psVar62->_M_dataplus)._M_p;
          lVar56 = uVar45 * 0x18;
          plVar9 = *(long **)(pcVar8 + lVar56);
          pTStack_200 = (pointer)0x0;
          _header = (pointer)&local_1f8;
          local_1f8._M_allocated_capacity = local_1f8._M_allocated_capacity & 0xffffffffffffff00;
          if ((((pEVar53->width < pEVar32->tile_size_x) || (pEVar53->height < pEVar32->tile_size_y))
              && (pEVar53->level_x == 0)) && (pEVar53->level_y == 0)) {
LAB_001abbaa:
            std::__cxx11::string::append(header);
            if (pTStack_200 != (pointer)0x0) {
              std::__cxx11::string::append((string *)&num_y_tiles);
            }
            bVar25 = false;
          }
          else {
            iVar27 = (int)((*(long *)(pcVar8 + lVar56 + 8) - (long)plVar9) / 0x18);
            iVar38 = (int)((ulong)(plVar9[1] - *plVar9) >> 3);
            uVar28 = iVar27 * iVar38;
            uVar54 = 0;
            uVar34 = (ulong)uVar28;
            if ((int)uVar28 < 1) {
              uVar34 = uVar54;
            }
            iVar43 = 0;
            lVar46 = 0x18;
            bVar25 = false;
            for (; pvVar44 = local_1b0, uVar34 * 0x18 != uVar54; uVar54 = uVar54 + 0x18) {
              local_1a0 = (void *)CONCAT44(local_1a0._4_4_,iVar43);
              pEVar10 = pEVar53->tiles;
              ppuVar11 = *(uchar ***)((long)&pEVar10->offset_x + lVar46);
              pvVar61 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1aba74;
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         ((long)&(local_1b0->
                                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start[local_120].
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data + uVar54),0x14);
              pvVar12 = (pvVar44->
                        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              uVar6 = *(undefined8 *)
                       ((long)&pvVar12[local_120].
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data + uVar54);
              uVar13 = *(undefined8 *)
                        ((long)&pvVar12[local_120].
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data + uVar54 + 8);
              bVar26 = EncodePixelData((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       ((long)&pvVar12[local_120].
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data + uVar54),ppuVar11,
                                       pEVar32->compression_type,
                                       *(int *)((long)pEVar10 + lVar46 + -8),pEVar32->tile_size_x,0,
                                       *(int *)((long)pEVar10 + lVar46 + -4),iVar42,iVar37,
                                       (size_t)&channel_offset_list,
                                       (vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                                        *)header,pvVar61,psVar62,compression_param);
              bVar22 = true;
              if (bVar26) {
                pvVar12 = (local_1b0->
                          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                piVar14 = *(int **)((long)&pvVar12[local_120].
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data + uVar54);
                iVar55 = *(int *)((long)&pvVar12[local_120].
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data + uVar54 + 8);
                *piVar14 = iVar43 % iVar38;
                *(int *)(*(long *)((long)&(local_1b0->
                                          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start[local_120].
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data + uVar54) + 4) =
                     iVar43 / iVar38;
                *(int *)(*(long *)((long)&(local_1b0->
                                          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start[local_120].
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data + uVar54) + 8) =
                     pEVar53->level_x;
                *(int *)(*(long *)((long)&(local_1b0->
                                          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start[local_120].
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data + uVar54) + 0xc) =
                     pEVar53->level_y;
                *(int *)(*(long *)((long)&(local_1b0->
                                          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start[local_120].
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data + uVar54) + 0x10) =
                     ((int)uVar6 + iVar55) - ((int)uVar13 + (int)piVar14);
                bVar22 = bVar25;
              }
              bVar25 = bVar22;
              lVar46 = lVar46 + 0x20;
              iVar43 = (int)local_1a0 + 1;
            }
            ppEVar47 = local_1b8;
            if (bVar25) goto LAB_001abbaa;
            for (lVar46 = 0; lVar46 != iVar27; lVar46 = lVar46 + 1) {
              lVar52 = local_120 * 3 + 1;
              for (lVar51 = 0; iVar38 != lVar51; lVar51 = lVar51 + 1) {
                *(pointer *)
                 (*(long *)(*(long *)((psVar62->_M_dataplus)._M_p + lVar56) + lVar46 * 0x18) +
                 lVar51 * 8) = puVar57;
                pvVar12 = (local_1b0->
                          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                puVar57 = puVar57 + ((*(long *)((long)&(pvVar12->
                                                                                                              
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  )._M_impl.super__Vector_impl_data + lVar52 * 8) +
                                     lVar58) - *(long *)((long)pvVar12 + lVar52 * 8 + -8));
                lVar52 = lVar52 + 3;
              }
              local_120 = local_120 + lVar51;
            }
            pEVar53 = pEVar53->next_level;
            bVar25 = true;
          }
          std::__cxx11::string::~string((string *)header);
          uVar45 = uVar45 + 1;
          pvVar63 = compression_param;
        } while (bVar25);
      }
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&channel_offset_list.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      puVar57 = local_218;
      if ((!bVar60) &&
         (puVar57 = local_1a8,
         num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish != (pointer)0x0)) {
        SetErrorMessage((string *)&num_y_tiles,local_1c0);
        puVar57 = local_1a8;
      }
      std::__cxx11::string::~string((string *)&num_y_tiles);
      pvVar29 = (void *)((long)pvVar29 + 1);
      local_1a8 = puVar57;
    } while (bVar60);
    local_218 = (pointer)0x0;
LAB_001ac1cd:
    std::
    vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
    ::~vector(&data_lists);
LAB_001ac1da:
    std::
    vector<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>,_std::allocator<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>_>_>
    ::~vector(&channels);
    std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::~vector(&offset_data);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&chunk_count.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return (size_t)local_218;
  }
  std::__cxx11::string::string
            ((string *)header,"Invalid argument for SaveEXRNPartImageToMemory",
             (allocator *)&num_y_tiles);
LAB_001aafc1:
  SetErrorMessage((string *)header,err);
  std::__cxx11::string::~string((string *)header);
  return (size_t)(pointer)0x0;
code_r0x001aaf43:
  pcVar49 = "ZFP compression is not supported in this build";
LAB_001aafa4:
  std::__cxx11::string::string((string *)header,pcVar49,(allocator *)&num_y_tiles);
  err = local_1c0;
  goto LAB_001aafc1;
}

Assistant:

static size_t SaveEXRNPartImageToMemory(const EXRImage* exr_images,
                                        const EXRHeader** exr_headers,
                                        unsigned int num_parts,
                                        unsigned char** memory_out, const char** err) {
  if (exr_images == NULL || exr_headers == NULL || num_parts == 0 ||
      memory_out == NULL) {
    SetErrorMessage("Invalid argument for SaveEXRNPartImageToMemory",
                    err);
    return 0;
  }
  {
    for (unsigned int i = 0; i < num_parts; ++i) {
      if (exr_headers[i]->compression_type < 0) {
        SetErrorMessage("Invalid argument for SaveEXRNPartImageToMemory",
                        err);
        return 0;
      }
#if !TINYEXR_USE_PIZ
      if (exr_headers[i]->compression_type == TINYEXR_COMPRESSIONTYPE_PIZ) {
        SetErrorMessage("PIZ compression is not supported in this build",
                        err);
        return 0;
      }
#endif
#if !TINYEXR_USE_ZFP
      if (exr_headers[i]->compression_type == TINYEXR_COMPRESSIONTYPE_ZFP) {
        SetErrorMessage("ZFP compression is not supported in this build",
                        err);
        return 0;
      }
#else
      for (int c = 0; c < exr_header->num_channels; ++c) {
        if (exr_headers[i]->requested_pixel_types[c] != TINYEXR_PIXELTYPE_FLOAT) {
          SetErrorMessage("Pixel type must be FLOAT for ZFP compression",
                          err);
          return 0;
        }
      }
#endif
    }
  }

  std::vector<unsigned char> memory;

  // Header
  {
    const char header[] = { 0x76, 0x2f, 0x31, 0x01 };
    memory.insert(memory.end(), header, header + 4);
  }

  // Version
  // using value from the first header
  int long_name = exr_headers[0]->long_name;
  {
    char marker[] = { 2, 0, 0, 0 };
    /* @todo
    if (exr_header->non_image) {
    marker[1] |= 0x8;
    }
    */
    // tiled
    if (num_parts == 1 && exr_images[0].tiles) {
      marker[1] |= 0x2;
    }
    // long_name
    if (long_name) {
      marker[1] |= 0x4;
    }
    // multipart
    if (num_parts > 1) {
      marker[1] |= 0x10;
    }
    memory.insert(memory.end(), marker, marker + 4);
  }

  int total_chunk_count = 0;
  std::vector<int> chunk_count(num_parts);
  std::vector<OffsetData> offset_data(num_parts);
  for (unsigned int i = 0; i < num_parts; ++i) {
    if (!exr_images[i].tiles) {
      int num_scanlines = NumScanlines(exr_headers[i]->compression_type);
      chunk_count[i] =
        (exr_images[i].height + num_scanlines - 1) / num_scanlines;
      InitSingleResolutionOffsets(offset_data[i], chunk_count[i]);
      total_chunk_count += chunk_count[i];
    } else {
      {
        std::vector<int> num_x_tiles, num_y_tiles;
        PrecalculateTileInfo(num_x_tiles, num_y_tiles, exr_headers[i]);
        chunk_count[i] =
          InitTileOffsets(offset_data[i], exr_headers[i], num_x_tiles, num_y_tiles);
        total_chunk_count += chunk_count[i];
      }
    }
  }
  // Write attributes to memory buffer.
  std::vector< std::vector<tinyexr::ChannelInfo> > channels(num_parts);
  {
    std::set<std::string> partnames;
    for (unsigned int i = 0; i < num_parts; ++i) {
      //channels
      {
        std::vector<unsigned char> data;

        for (int c = 0; c < exr_headers[i]->num_channels; c++) {
          tinyexr::ChannelInfo info;
          info.p_linear = 0;
          info.pixel_type = exr_headers[i]->pixel_types[c];
          info.requested_pixel_type = exr_headers[i]->requested_pixel_types[c];
          info.x_sampling = 1;
          info.y_sampling = 1;
          info.name = std::string(exr_headers[i]->channels[c].name);
          channels[i].push_back(info);
        }

        tinyexr::WriteChannelInfo(data, channels[i]);

        tinyexr::WriteAttributeToMemory(&memory, "channels", "chlist", &data.at(0),
                                        static_cast<int>(data.size()));
      }

      {
        int comp = exr_headers[i]->compression_type;
        swap4(&comp);
        WriteAttributeToMemory(
          &memory, "compression", "compression",
          reinterpret_cast<const unsigned char*>(&comp), 1);
      }

      {
        int data[4] = { 0, 0, exr_images[i].width - 1, exr_images[i].height - 1 };
        swap4(&data[0]);
        swap4(&data[1]);
        swap4(&data[2]);
        swap4(&data[3]);
        WriteAttributeToMemory(
          &memory, "dataWindow", "box2i",
          reinterpret_cast<const unsigned char*>(data), sizeof(int) * 4);

        int data0[4] = { 0, 0, exr_images[0].width - 1, exr_images[0].height - 1 };
        swap4(&data0[0]);
        swap4(&data0[1]);
        swap4(&data0[2]);
        swap4(&data0[3]);
        // Note: must be the same across parts (currently, using value from the first header)
        WriteAttributeToMemory(
          &memory, "displayWindow", "box2i",
          reinterpret_cast<const unsigned char*>(data0), sizeof(int) * 4);
      }

      {
        unsigned char line_order = 0;  // @fixme { read line_order from EXRHeader }
        WriteAttributeToMemory(&memory, "lineOrder", "lineOrder",
                               &line_order, 1);
      }

      {
        // Note: must be the same across parts
        float aspectRatio = 1.0f;
        swap4(&aspectRatio);
        WriteAttributeToMemory(
          &memory, "pixelAspectRatio", "float",
          reinterpret_cast<const unsigned char*>(&aspectRatio), sizeof(float));
      }

      {
        float center[2] = { 0.0f, 0.0f };
        swap4(&center[0]);
        swap4(&center[1]);
        WriteAttributeToMemory(
          &memory, "screenWindowCenter", "v2f",
          reinterpret_cast<const unsigned char*>(center), 2 * sizeof(float));
      }

      {
        float w = 1.0f;
        swap4(&w);
        WriteAttributeToMemory(&memory, "screenWindowWidth", "float",
                               reinterpret_cast<const unsigned char*>(&w),
                               sizeof(float));
      }

      if (exr_images[i].tiles) {
        unsigned char tile_mode = static_cast<unsigned char>(exr_headers[i]->tile_level_mode & 0x3);
        if (exr_headers[i]->tile_rounding_mode) tile_mode |= (1u << 4u);
        //unsigned char data[9] = { 0, 0, 0, 0, 0, 0, 0, 0, 0 };
        unsigned int datai[3] = { 0, 0, 0 };
        unsigned char* data = reinterpret_cast<unsigned char*>(&datai[0]);
        datai[0] = static_cast<unsigned int>(exr_headers[i]->tile_size_x);
        datai[1] = static_cast<unsigned int>(exr_headers[i]->tile_size_y);
        data[8] = tile_mode;
        swap4(reinterpret_cast<unsigned int*>(&data[0]));
        swap4(reinterpret_cast<unsigned int*>(&data[4]));
        WriteAttributeToMemory(
          &memory, "tiles", "tiledesc",
          reinterpret_cast<const unsigned char*>(data), 9);
      }

      // must be present for multi-part files - according to spec.
      if (num_parts > 1) {
        // name
        {
          size_t len = 0;
          if ((len = strlen(exr_headers[i]->name)) > 0) {
            partnames.emplace(exr_headers[i]->name);
            if (partnames.size() != i + 1) {
              SetErrorMessage("'name' attributes must be unique for a multi-part file", err);
              return 0;
            }
            WriteAttributeToMemory(
              &memory, "name", "string",
              reinterpret_cast<const unsigned char*>(exr_headers[i]->name),
              static_cast<int>(len));
          } else {
            SetErrorMessage("Invalid 'name' attribute for a multi-part file", err);
            return 0;
          }
        }
        // type
        {
          const char* type = "scanlineimage";
          if (exr_images[i].tiles) type = "tiledimage";
          WriteAttributeToMemory(
            &memory, "type", "string",
            reinterpret_cast<const unsigned char*>(type),
            static_cast<int>(strlen(type)));
        }
        // chunkCount
        {
          WriteAttributeToMemory(
            &memory, "chunkCount", "int",
            reinterpret_cast<const unsigned char*>(&chunk_count[i]),
            4);
        }
      }

      // Custom attributes
      if (exr_headers[i]->num_custom_attributes > 0) {
        for (int j = 0; j < exr_headers[i]->num_custom_attributes; j++) {
          tinyexr::WriteAttributeToMemory(
            &memory, exr_headers[i]->custom_attributes[j].name,
            exr_headers[i]->custom_attributes[j].type,
            reinterpret_cast<const unsigned char*>(
              exr_headers[i]->custom_attributes[j].value),
            exr_headers[i]->custom_attributes[j].size);
        }
      }

      {  // end of header
        memory.push_back(0);
      }
    }
  }
  if (num_parts > 1) {
    // end of header list
    memory.push_back(0);
  }

  tinyexr_uint64 chunk_offset = memory.size() + size_t(total_chunk_count) * sizeof(tinyexr_uint64);

  tinyexr_uint64 total_size = 0;
  std::vector< std::vector< std::vector<unsigned char> > > data_lists(num_parts);
  for (unsigned int i = 0; i < num_parts; ++i) {
    std::string e;
    int ret = EncodeChunk(&exr_images[i], exr_headers[i],
                          channels[i],
                          chunk_count[i],
                          // starting offset of current chunk after part-number
                          chunk_offset,
                          num_parts > 1,
                          offset_data[i], // output: block offsets, must be initialized
                          data_lists[i], // output
                          total_size, // output
                          &e);
    if (ret != TINYEXR_SUCCESS) {
      if (!e.empty()) {
        tinyexr::SetErrorMessage(e, err);
      }
      return 0;
    }
    chunk_offset = total_size;
  }

  // Allocating required memory
  if (total_size == 0) { // something went wrong
    tinyexr::SetErrorMessage("Output memory size is zero", err);
    return 0;
  }
  (*memory_out) = static_cast<unsigned char*>(malloc(size_t(total_size)));

  // Writing header
  memcpy((*memory_out), &memory[0], memory.size());
  unsigned char* memory_ptr = *memory_out + memory.size();
  size_t sum = memory.size();
  ((void)(sum));

  // Writing offset data for chunks
  for (unsigned int i = 0; i < num_parts; ++i) {
    if (exr_images[i].tiles) {
      const EXRImage* level_image = &exr_images[i];
      int num_levels = (exr_headers[i]->tile_level_mode != TINYEXR_TILE_RIPMAP_LEVELS) ?
        offset_data[i].num_x_levels : (offset_data[i].num_x_levels * offset_data[i].num_y_levels);
      for (int level_index = 0; level_index < num_levels; ++level_index) {
        for (size_t j = 0; j < offset_data[i].offsets[level_index].size(); ++j) {
          size_t num_bytes = sizeof(tinyexr_uint64) * offset_data[i].offsets[level_index][j].size();
          sum += num_bytes;
          assert(sum <= total_size);
          memcpy(memory_ptr,
                 reinterpret_cast<unsigned char*>(&offset_data[i].offsets[level_index][j][0]),
                 num_bytes);
          memory_ptr += num_bytes;
        }
        level_image = level_image->next_level;
      }
    } else {
      size_t num_bytes = sizeof(tinyexr::tinyexr_uint64) * static_cast<size_t>(chunk_count[i]);
      sum += num_bytes;
      assert(sum <= total_size);
      std::vector<tinyexr::tinyexr_uint64>& offsets = offset_data[i].offsets[0][0];
      memcpy(memory_ptr, reinterpret_cast<unsigned char*>(&offsets[0]), num_bytes);
      memory_ptr += num_bytes;
    }
  }

  // Writing chunk data
  for (unsigned int i = 0; i < num_parts; ++i) {
    for (size_t j = 0; j < static_cast<size_t>(chunk_count[i]); ++j) {
      if (num_parts > 1) {
        sum += 4;
        assert(sum <= total_size);
        unsigned int part_number = i;
        swap4(&part_number);
        memcpy(memory_ptr, &part_number, 4);
        memory_ptr += 4;
      }
      sum += data_lists[i][j].size();
      assert(sum <= total_size);
      memcpy(memory_ptr, &data_lists[i][j][0], data_lists[i][j].size());
      memory_ptr += data_lists[i][j].size();
    }
  }
  assert(sum == total_size);
  return size_t(total_size);  // OK
}